

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O0

bool __thiscall
Storage::Tape::Oric::Parser::sync_and_get_encoding_speed
          (Parser *this,shared_ptr<Storage::Tape::Tape> *tape)

{
  int iVar1;
  SymbolType SVar2;
  element_type *peVar3;
  SymbolType symbol;
  shared_ptr<Storage::Tape::Tape> *tape_local;
  Parser *this_local;
  
  this->detection_mode_ = Sync;
  while( true ) {
    peVar3 = std::__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)tape);
    iVar1 = (**peVar3->_vptr_Tape)();
    if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
      return false;
    }
    SVar2 = Parser<Storage::Tape::Oric::SymbolType>::get_next_symbol
                      ((Parser<Storage::Tape::Oric::SymbolType> *)this,tape);
    if (SVar2 == FoundFast) break;
    if (SVar2 == FoundSlow) {
      return false;
    }
  }
  return true;
}

Assistant:

bool Parser::sync_and_get_encoding_speed(const std::shared_ptr<Storage::Tape::Tape> &tape) {
	detection_mode_ = Sync;
	while(!tape->is_at_end()) {
		const SymbolType symbol = get_next_symbol(tape);
		switch(symbol) {
			case SymbolType::FoundSlow: return false;
			case SymbolType::FoundFast: return true;
			default: break;
		}
	}
	return false;
}